

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O1

const_iterator __thiscall QJsonObject::constFindImpl<QStringView>(QJsonObject *this,QStringView key)

{
  QCborContainerPrivate *pQVar1;
  qsizetype qVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  const_iterator cVar4;
  bool keyExists;
  bool local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_11 = false;
  if ((this->o).d.ptr == (QCborContainerPrivate *)0x0) {
    uVar3 = 1;
  }
  else {
    qVar2 = indexOf<QStringView>(&this->o,key,&local_11);
    uVar3 = qVar2 - (qVar2 >> 0x3f) | 1;
  }
  if (local_11 == false) {
    pQVar1 = (this->o).d.ptr;
    if (pQVar1 == (QCborContainerPrivate *)0x0) {
      uVar3 = 1;
    }
    else {
      uVar3 = (pQVar1->elements).d.size | 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    cVar4.item._8_8_ = uVar3;
    cVar4.item.field_0.o = this;
    return (const_iterator)cVar4.item;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::const_iterator QJsonObject::constFindImpl(T key) const
{
    bool keyExists = false;
    auto index = o ? indexOf(o, key, &keyExists) : 0;
    if (!keyExists)
        return end();
    return {this, index / 2};
}